

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIFileOpenDialog::fillListBox(CGUIFileOpenDialog *this)

{
  int *piVar1;
  _Alloc_hider _Var2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  _func_int *p_Var6;
  undefined4 extraout_var;
  path *p;
  undefined4 extraout_var_00;
  uint uVar8;
  IGUIListBox *pIVar9;
  CGUIFileOpenDialog *pCVar10;
  stringw s;
  stringw local_50;
  IFileList *pIVar7;
  
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if ((this->FileSystem != (IFileSystem *)0x0) &&
     (pIVar9 = this->FileBox, plVar5 != (long *)0x0 && pIVar9 != (IGUIListBox *)0x0)) {
    pIVar7 = this->FileList;
    if (pIVar7 != (IFileList *)0x0) {
      p_Var6 = pIVar7->_vptr_IFileList[-3];
      piVar1 = (int *)(&pIVar7->field_0x10 + (long)p_Var6);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        p_Var6 = (_func_int *)((long)&pIVar7->_vptr_IFileList + (long)p_Var6);
        (**(code **)(*(long *)p_Var6 + 8))(p_Var6);
        pIVar9 = this->FileBox;
      }
    }
    (*(pIVar9->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])();
    iVar3 = (*this->FileSystem->_vptr_IFileSystem[0x18])();
    pIVar7 = (IFileList *)CONCAT44(extraout_var,iVar3);
    this->FileList = pIVar7;
    local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = L'\0';
    if (pIVar7 != (IFileList *)0x0) {
      iVar3 = (**pIVar7->_vptr_IFileList)(pIVar7);
      if (iVar3 != 0) {
        uVar8 = 0;
        do {
          pCVar10 = (CGUIFileOpenDialog *)this->FileList;
          p = (path *)(**(code **)(*(long *)pCVar10 + 8))(pCVar10,uVar8);
          pathToStringW(pCVar10,&local_50,p);
          _Var2._M_p = local_50.str._M_dataplus._M_p;
          pIVar9 = this->FileBox;
          uVar4 = (*this->FileList->_vptr_IFileList[6])(this->FileList,(ulong)uVar8);
          uVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,(uVar4 & 0xff) + 0x15);
          (*(pIVar9->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x27])
                    (pIVar9,_Var2._M_p,(ulong)uVar4);
          uVar8 = uVar8 + 1;
          uVar4 = (**this->FileList->_vptr_IFileList)();
        } while (uVar8 < uVar4);
      }
    }
    if (this->FileNameText != (IGUIEditBox *)0x0) {
      iVar3 = (*this->FileSystem->_vptr_IFileSystem[0x11])();
      pCVar10 = this;
      setDirectoryName(this,(path *)CONCAT44(extraout_var_00,iVar3));
      pathToStringW(pCVar10,&local_50,&this->FileDirectory);
      (*(this->FileNameText->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
                (this->FileNameText,local_50.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,
                      CONCAT44(local_50.str.field_2._M_local_buf[1],
                               local_50.str.field_2._M_local_buf[0]) * 4 + 4);
    }
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::fillListBox()
{
	IGUISkin *skin = Environment->getSkin();

	if (!FileSystem || !FileBox || !skin)
		return;

	if (FileList)
		FileList->drop();

	FileBox->clear();

	FileList = FileSystem->createFileList();
	core::stringw s;

	if (FileList) {
		for (u32 i = 0; i < FileList->getFileCount(); ++i) {
			pathToStringW(s, FileList->getFileName(i));
			FileBox->addItem(s.c_str(), skin->getIcon(FileList->isDirectory(i) ? EGDI_DIRECTORY : EGDI_FILE));
		}
	}

	if (FileNameText) {
		setDirectoryName(FileSystem->getWorkingDirectory());
		pathToStringW(s, FileDirectory);
		FileNameText->setText(s.c_str());
	}
}